

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgets.cpp
# Opt level: O0

QRect __thiscall QAccessibleDockWidget::rect(QAccessibleDockWidget *this)

{
  long lVar1;
  bool bVar2;
  QWidget *this_00;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QRect QVar3;
  QRect rect;
  QRect *in_stack_ffffffffffffff88;
  QRect *in_stack_ffffffffffffff90;
  QPoint *in_stack_ffffffffffffff98;
  QWidget *in_stack_ffffffffffffffc8;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QRect::QRect(in_stack_ffffffffffffff90);
  dockWidget((QAccessibleDockWidget *)0x7e56f1);
  bVar2 = QDockWidget::isFloating((QDockWidget *)0x7e56f9);
  if (bVar2) {
    dockWidget((QAccessibleDockWidget *)0x7e5709);
    QVar3 = QWidget::frameGeometry(in_stack_ffffffffffffffc8);
    local_28 = QVar3._0_8_;
    local_18 = local_28;
    local_20 = QVar3._8_8_;
    local_10 = local_20;
  }
  else {
    dockWidget((QAccessibleDockWidget *)0x7e573b);
    QVar3 = QWidget::rect(in_RDI);
    local_18 = QVar3._0_8_;
    local_30 = QVar3._8_8_;
    local_10 = local_30;
    this_00 = &dockWidget((QAccessibleDockWidget *)0x7e576b)->super_QWidget;
    QRect::topLeft(in_stack_ffffffffffffff88);
    QWidget::mapToGlobal(this_00,in_stack_ffffffffffffff98);
    QRect::moveTopLeft(in_stack_ffffffffffffff90,(QPoint *)in_stack_ffffffffffffff88);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar3.x2.m_i = (undefined4)local_10;
    QVar3.y2.m_i = local_10._4_4_;
    QVar3.x1.m_i = (undefined4)local_18;
    QVar3.y1.m_i = local_18._4_4_;
    return QVar3;
  }
  __stack_chk_fail();
}

Assistant:

QRect QAccessibleDockWidget::rect() const
{
    QRect rect;

    if (dockWidget()->isFloating()) {
        rect = dockWidget()->frameGeometry();
    } else {
        rect = dockWidget()->rect();
        rect.moveTopLeft(dockWidget()->mapToGlobal(rect.topLeft()));
    }

    return rect;
}